

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializeToCodedStream(MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  string_view action;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string local_78;
  byte local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  CodedOutputStream *local_18;
  CodedOutputStream *output_local;
  MessageLite *this_local;
  
  local_18 = output;
  output_local = (CodedOutputStream *)this;
  bVar1 = IsInitialized(this);
  local_41 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"IsInitialized()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message_lite.cc"
               ,0x1ee,local_40._M_len);
    local_41 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"serialize");
    action._M_str = (char *)this;
    action._M_len = (size_t)local_88._M_str;
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_78,(void *)local_88._M_len,action,(MessageLite *)local_40._M_str);
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)&local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar2);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_41 & 1) == 0) {
    bVar1 = SerializePartialToCodedStream(this,local_18);
    return bVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

bool MessageLite::SerializeToCodedStream(io::CodedOutputStream* output) const {
  ABSL_DCHECK(IsInitialized())
      << InitializationErrorMessage("serialize", *this);
  return SerializePartialToCodedStream(output);
}